

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::MoveFromMemByRegToReg::TryToGenerateCode
          (MoveFromMemByRegToReg *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CMoveStatement *this_00;
  CExpression *pCVar1;
  CMemExpression *this_01;
  CTempExpression *this_02;
  CTempExpression *this_03;
  CTemp *__args_1;
  CTemp rightRegister;
  CTemp CStack_98;
  pair<IRT::CTemp,_const_IRT::INode_*> local_78;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_50;
  
  if (tree != (INode *)0x0) {
    this_00 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
    if (this_00 == (CMoveStatement *)0x0) {
      return false;
    }
    pCVar1 = CMoveStatement::Source(this_00);
    if (pCVar1 == (CExpression *)0x0) {
      this_01 = (CMemExpression *)0x0;
    }
    else {
      this_01 = (CMemExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    pCVar1 = CMoveStatement::Target(this_00);
    if (pCVar1 != (CExpression *)0x0) {
      this_02 = (CTempExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      if (this_02 == (CTempExpression *)0x0 || this_01 == (CMemExpression *)0x0) {
        return false;
      }
      pCVar1 = CMemExpression::getAddress(this_01);
      if (pCVar1 == (CExpression *)0x0) {
        this_03 = (CTempExpression *)0x0;
      }
      else {
        this_03 = (CTempExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      CTemp::CTemp(&CStack_98);
      if (this_03 == (CTempExpression *)0x0) {
        pCVar1 = CMemExpression::getAddress(this_01);
        std::__cxx11::string::string((string *)&local_50,(string *)&CStack_98);
        local_50.second = pCVar1;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_78,&local_50);
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        CTempExpression::getTemprorary(this_03);
        std::__cxx11::string::_M_assign((string *)&CStack_98);
      }
      __args_1 = CTempExpression::getTemprorary(this_02);
      std::make_shared<AssemblyCode::MoveToRegFromMemByReg,IRT::CTemp_const&,IRT::CTemp&>
                (&local_78.first,__args_1);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveToRegFromMemByReg>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveToRegFromMemByReg> *)&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.first.name._M_string_length
                );
      std::__cxx11::string::~string((string *)&CStack_98);
      return true;
    }
  }
  return false;
}

Assistant:

bool
IRT::MoveFromMemByRegToReg::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                               AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr sourceMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Source( ));
        ConstTempPtr addressPtr = dynamic_cast<ConstTempPtr>(movePtr->Target( ));
        if ( sourceMemPtr && addressPtr ) {
            ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(sourceMemPtr->getAddress( ));
            CTemp rightRegister;
            if ( !sourceRegPtr ) {
                children.push_back( std::make_pair( rightRegister, sourceMemPtr->getAddress( )));
            } else {
                rightRegister = sourceRegPtr->getTemprorary( );
            }
            commands.emplace_back( std::make_shared<AssemblyCode::MoveToRegFromMemByReg>( addressPtr->getTemprorary( ),
                                                                                          rightRegister ));
            return true;
        }
    }
    return false;
}